

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O1

int __thiscall booster::shared_object::open(shared_object *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  void *pvVar2;
  char *__s;
  data *pdVar3;
  
  if (((this->d).ptr_)->handle != (void *)0x0) {
    dlclose();
    ((this->d).ptr_)->handle = (void *)0x0;
  }
  pvVar2 = (void *)dlopen(*(undefined8 *)__file);
  pdVar3 = (this->d).ptr_;
  pdVar3->handle = pvVar2;
  if (pvVar2 == (void *)0x0) {
    __s = (char *)dlerror();
    pcVar1 = *(char **)(___oflag + 8);
    strlen(__s);
    pdVar3 = (data *)std::__cxx11::string::_M_replace(___oflag,0,pcVar1,(ulong)__s);
  }
  return (int)CONCAT71((int7)((ulong)pdVar3 >> 8),pvVar2 != (void *)0x0);
}

Assistant:

bool shared_object::open(std::string const &file_name,std::string &error_message,int flags)
	{
		close();
		int dlflags = 0;
		if(flags & load_lazy)
			dlflags |= RTLD_LAZY;
		if(flags & load_now)
			dlflags |= RTLD_NOW;
		if(flags & load_global)
			dlflags |= RTLD_GLOBAL;
		if(flags & load_local)
			dlflags |= RTLD_LOCAL;
		d->handle = dlopen(file_name.c_str(),dlflags);
		if(!d->handle) {
			error_message = dlerror();
			return false;
		}
		return true;
	}